

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O0

void __thiscall FTTYStartupScreen::NetProgress(FTTYStartupScreen *this,int count)

{
  int local_18;
  int i;
  int count_local;
  FTTYStartupScreen *this_local;
  
  if (count == 0) {
    this->NetCurPos = this->NetCurPos + 1;
  }
  else if (0 < count) {
    this->NetCurPos = count;
  }
  if (this->NetMaxPos == 0) {
    fprintf(_stderr,"\r%s: %c",this->TheNetMessage,
            (ulong)(uint)(int)"|/-\\"[(int)(this->NetCurPos & 3)]);
    fflush(_stderr);
  }
  else if (1 < this->NetMaxPos) {
    fprintf(_stderr,"\r%s: ",this->TheNetMessage);
    for (local_18 = 0; local_18 < this->NetCurPos; local_18 = local_18 + 1) {
      fputc(0x2e,_stderr);
    }
    fprintf(_stderr,"%*c[%2d/%2d]",(ulong)(uint)((this->NetMaxPos + 1) - this->NetCurPos),0x20,
            (ulong)(uint)this->NetCurPos,(ulong)(uint)this->NetMaxPos);
    fflush(_stderr);
  }
  return;
}

Assistant:

void FTTYStartupScreen::NetProgress(int count)
{
	int i;

	if (count == 0)
	{
		NetCurPos++;
	}
	else if (count > 0)
	{
		NetCurPos = count;
	}
	if (NetMaxPos == 0)
	{
		// Spinny-type progress meter, because we're a guest waiting for the host.
		fprintf (stderr, "\r%s: %c", TheNetMessage, SpinnyProgressChars[NetCurPos & 3]);
		fflush (stderr);
	}
	else if (NetMaxPos > 1)
	{
		// Dotty-type progress meter.
		fprintf (stderr, "\r%s: ", TheNetMessage);
		for (i = 0; i < NetCurPos; ++i)
		{
			fputc ('.', stderr);
		}
		fprintf (stderr, "%*c[%2d/%2d]", NetMaxPos + 1 - NetCurPos, ' ', NetCurPos, NetMaxPos);
		fflush (stderr);
	}
}